

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O0

void * sx__aligned_realloc(sx_alloc *alloc,void *ptr,size_t size,uint32_t align,char *file,
                          char *func,uint32_t line)

{
  uint uVar1;
  code *pcVar2;
  void *pvVar3;
  sx_alloc *__dest;
  uint local_74;
  uint32_t *header;
  uint8_t *new_aligned;
  size_t total;
  int var__b;
  int var__a;
  uint32_t offset;
  uint8_t *aligned;
  char *func_local;
  char *file_local;
  uint32_t align_local;
  size_t size_local;
  void *ptr_local;
  sx_alloc *alloc_local;
  
  if (ptr == (void *)0x0) {
    alloc_local = (sx_alloc *)sx__aligned_alloc(alloc,size,align,file,func,line);
  }
  else {
    uVar1 = *(uint *)((long)ptr + -4);
    local_74 = align;
    if ((int)align < 9) {
      local_74 = 8;
    }
    pvVar3 = sx__realloc(alloc,(void *)((long)ptr - (ulong)uVar1),size + local_74 + 4,0,file,func,
                         line);
    if (pvVar3 == (void *)0x0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/allocator.h"
                        ,0xcd,"ptr");
      pcVar2 = (code *)swi(3);
      pvVar3 = (void *)(*pcVar2)();
      return pvVar3;
    }
    __dest = (sx_alloc *)sx_align_ptr(pvVar3,4,local_74);
    alloc_local = (sx_alloc *)ptr;
    if (__dest != (sx_alloc *)ptr) {
      memmove(__dest,(void *)((long)pvVar3 + (ulong)uVar1),size);
      *(int *)((long)&__dest[-1].user_data + 4) = (int)__dest - (int)pvVar3;
      alloc_local = __dest;
    }
  }
  return alloc_local;
}

Assistant:

SX_INLINE void* sx__aligned_realloc(const sx_alloc* alloc, void* ptr, size_t size, uint32_t align, 
                                    const char* file, const char* func, uint32_t line)
{
    if (ptr == NULL)
        return sx__aligned_alloc(alloc, size, align, file, func, line);

    uint8_t* aligned = (uint8_t*)ptr;
    uint32_t offset = *((uint32_t*)aligned - 1);
    ptr = aligned - offset;

    align = sx_max((int)align, SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT);
    const size_t total = size + align + sizeof(uint32_t);
    ptr = sx__realloc(alloc, ptr, total, 0, file, func, line);
    sx_assert(ptr);
    uint8_t* new_aligned = (uint8_t*)sx_align_ptr(ptr, sizeof(uint32_t), align);

    if (new_aligned == aligned)
        return aligned;

    aligned = (uint8_t*)ptr + offset;
    sx_memmove(new_aligned, aligned, size);
    uint32_t* header = (uint32_t*)new_aligned - 1;
    *header = (uint32_t)(new_aligned - (uint8_t*)ptr);
    return new_aligned;
}